

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1ResizeHash(PCache1 *p)

{
  uint uVar1;
  PgHdr1 *pPVar2;
  ulong uVar3;
  PgHdr1 *pPVar4;
  PgHdr1 **__s;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = p->nHash * 2;
  uVar5 = 0x100;
  if (0x100 < uVar1) {
    uVar5 = uVar1;
  }
  if ((p->nHash != 0) && (sqlite3Hooks_0 != (code *)0x0)) {
    (*sqlite3Hooks_0)();
  }
  __s = (PgHdr1 **)sqlite3Malloc((ulong)uVar5 << 3);
  if (__s != (PgHdr1 **)0x0) {
    memset(__s,0,(ulong)uVar5 << 3);
  }
  if ((p->nHash != 0) && (sqlite3Hooks_1 != (code *)0x0)) {
    (*sqlite3Hooks_1)();
  }
  if (__s != (PgHdr1 **)0x0) {
    uVar1 = p->nHash;
    if ((ulong)uVar1 != 0) {
      uVar6 = 0;
      do {
        pPVar4 = p->apHash[uVar6];
        while (pPVar4 != (PgHdr1 *)0x0) {
          uVar3 = (ulong)pPVar4->iKey % (ulong)uVar5;
          pPVar2 = pPVar4->pNext;
          pPVar4->pNext = __s[uVar3];
          __s[uVar3] = pPVar4;
          pPVar4 = pPVar2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1);
    }
    sqlite3_free(p->apHash);
    p->apHash = __s;
    p->nHash = uVar5;
  }
  return;
}

Assistant:

static void pcache1ResizeHash(PCache1 *p){
  PgHdr1 **apNew;
  unsigned int nNew;
  unsigned int i;

  assert( sqlite3_mutex_held(p->pGroup->mutex) );

  nNew = p->nHash*2;
  if( nNew<256 ){
    nNew = 256;
  }

  pcache1LeaveMutex(p->pGroup);
  if( p->nHash ){ sqlite3BeginBenignMalloc(); }
  apNew = (PgHdr1 **)sqlite3MallocZero(sizeof(PgHdr1 *)*nNew);
  if( p->nHash ){ sqlite3EndBenignMalloc(); }
  pcache1EnterMutex(p->pGroup);
  if( apNew ){
    for(i=0; i<p->nHash; i++){
      PgHdr1 *pPage;
      PgHdr1 *pNext = p->apHash[i];
      while( (pPage = pNext)!=0 ){
        unsigned int h = pPage->iKey % nNew;
        pNext = pPage->pNext;
        pPage->pNext = apNew[h];
        apNew[h] = pPage;
      }
    }
    sqlite3_free(p->apHash);
    p->apHash = apNew;
    p->nHash = nNew;
  }
}